

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_src.c
# Opt level: O0

int seed_src_generate(void *vseed,uchar *out,size_t outlen,uint strength,int prediction_resistance,
                     uchar *adin,size_t adin_len)

{
  RAND_POOL *pool_00;
  size_t sVar1;
  uchar *__src;
  size_t __n;
  int in_ECX;
  int iVar3;
  void *in_RSI;
  size_t in_RDI;
  int in_R8D;
  size_t in_R9;
  RAND_POOL *pool;
  size_t entropy_available;
  PROV_SEED_SRC *s;
  char *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar2;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (*(int *)(in_RDI + 8) == 1) {
    pool_00 = ossl_rand_pool_new(in_ECX,in_R8D,in_R9,in_RDI);
    if (pool_00 == (RAND_POOL *)0x0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffc0,(int)((ulong)pool_00 >> 0x20),
                    in_stack_ffffffffffffffb0);
      ERR_set_error(0x39,0xc0100,(char *)0x0);
      uVar2 = 0;
    }
    else {
      sVar1 = ossl_pool_acquire_entropy
                        ((RAND_POOL *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
      ;
      if (sVar1 != 0) {
        __src = ossl_rand_pool_buffer(pool_00);
        __n = ossl_rand_pool_length(pool_00);
        memcpy(in_RSI,__src,__n);
      }
      ossl_rand_pool_free((RAND_POOL *)0x342352);
      uVar2 = (uint)(sVar1 != 0);
    }
  }
  else {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffc0,iVar3,in_stack_ffffffffffffffb0);
    _iVar3 = 0xc1;
    if (*(int *)(in_RDI + 8) == 2) {
      _iVar3 = 0xc0;
    }
    ERR_set_error(0x39,_iVar3,(char *)0x0);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static int seed_src_generate(void *vseed, unsigned char *out, size_t outlen,
                             unsigned int strength,
                             ossl_unused int prediction_resistance,
                             ossl_unused const unsigned char *adin,
                             ossl_unused size_t adin_len)
{
    PROV_SEED_SRC *s = (PROV_SEED_SRC *)vseed;
    size_t entropy_available;
    RAND_POOL *pool;

    if (s->state != EVP_RAND_STATE_READY) {
        ERR_raise(ERR_LIB_PROV,
                  s->state == EVP_RAND_STATE_ERROR ? PROV_R_IN_ERROR_STATE
                                                   : PROV_R_NOT_INSTANTIATED);
        return 0;
    }

    pool = ossl_rand_pool_new(strength, 1, outlen, outlen);
    if (pool == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    /* Get entropy by polling system entropy sources. */
    entropy_available = ossl_pool_acquire_entropy(pool);

    if (entropy_available > 0)
        memcpy(out, ossl_rand_pool_buffer(pool), ossl_rand_pool_length(pool));

    ossl_rand_pool_free(pool);
    return entropy_available > 0;
}